

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvaxtpeek.c
# Opt level: O1

int main(int argc,char **argv)

{
  void *pvVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  int32_t b;
  int32_t a;
  int cnum;
  uint32_t z [4];
  uint local_54;
  uint local_50;
  int local_4c;
  uint auStack_48 [6];
  
  iVar4 = nva_init();
  if (iVar4 == 0) {
    local_4c = 0;
    do {
      while (iVar4 = getopt(argc,argv,"c:"), iVar4 == 99) {
        __isoc99_sscanf(_optarg,"%d",&local_4c);
      }
    } while (iVar4 != -1);
    if (local_4c < nva_cardsnum) {
      local_54 = 4;
      if (_optind < argc) {
        __isoc99_sscanf(argv[_optind],"%x",&local_50);
        if (_optind + 1 < argc) {
          __isoc99_sscanf(argv[(long)_optind + 1],"%x",&local_54);
        }
        *(undefined4 *)((long)nva_cards[local_4c]->bar0 + 0x1700) = 0x30;
        if ((int)local_54 < 1) {
          return 0;
        }
        bVar3 = true;
        do {
          pvVar1 = nva_cards[local_4c]->bar0;
          uVar5 = 0;
          bVar2 = false;
          do {
            *(uint *)((long)pvVar1 + 0x700004) = local_50 + (int)uVar5;
            *(undefined4 *)((long)pvVar1 + 0x70000) = 1;
            do {
            } while (*(int *)((long)pvVar1 + 0x70000) != 0);
            *(undefined4 *)((long)pvVar1 + 0x700000) = 1;
            do {
            } while (*(int *)((long)pvVar1 + 0x700000) != 0);
            iVar4 = *(int *)((long)pvVar1 + 0x700004);
            *(int *)((long)auStack_48 + uVar5) = iVar4;
            if (iVar4 != 0) {
              bVar2 = true;
            }
          } while ((uVar5 < 0xc) && (uVar5 = uVar5 + 4, uVar5 < local_54));
          if (bVar2) {
            printf("%08x:",(ulong)local_50);
            if (0 < (int)local_54) {
              uVar5 = 0;
              do {
                printf(" %08x",(ulong)*(uint *)((long)auStack_48 + uVar5));
                if (0xb < uVar5) break;
                uVar5 = uVar5 + 4;
              } while ((long)uVar5 < (long)(int)local_54);
            }
            putchar(10);
            bVar2 = true;
          }
          else {
            bVar2 = false;
            if (bVar3) {
              puts("...");
            }
          }
          bVar3 = bVar2;
          local_50 = local_50 + 0x10;
          bVar2 = (int)local_54 < 0x11;
          local_54 = local_54 - 0x10;
          if (bVar2) {
            return 0;
          }
        } while( true );
      }
      main_cold_4();
    }
    else if (nva_cardsnum == 0) {
      main_cold_3();
    }
    else {
      main_cold_2();
    }
  }
  else {
    main_cold_1();
  }
  return 1;
}

Assistant:

int main(int argc, char **argv) {
	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}
	int c;
	int cnum =0;
	while ((c = getopt (argc, argv, "c:")) != -1)
		switch (c) {
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
		}
	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}
	int32_t a, b = 4, i;
	if (optind >= argc) {
		fprintf (stderr, "No address specified.\n");
		return 1;
	}
	sscanf (argv[optind], "%x", &a);
	if (optind + 1 < argc)
		sscanf (argv[optind + 1], "%x", &b);
	nva_wr32(cnum, 0x1700, 0x30);
	int ls = 1;
	while (b > 0) {
		uint32_t z[4];
		int s = 0;
		for (i = 0; i < 16 && i < b; i+=4)
			if ((z[i/4] = xt_rd32(cnum, a+i))) s = 1;
		if (s) {
			ls = 1;
			printf ("%08x:", a);
			for (i = 0; i < 16 && i < b; i+=4) {
				printf (" %08x", z[i/4]);
			}
			printf ("\n");
		} else  {
			if (ls) printf ("...\n"), ls = 0;
		}
		a+=16;
		b-=16;
	}
	return 0;
}